

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O1

void __thiscall gimage::JPEGImageIO::save(JPEGImageIO *this,ImageU8 *image,char *name)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  void *pvVar3;
  IOException *pIVar4;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  JSAMPROW row;
  jpeg_error_mgr jerr;
  allocator local_389;
  void *local_388;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined8 local_320 [6];
  undefined8 local_2f0;
  int local_2e8;
  int local_2e4;
  undefined1 local_d8 [168];
  
  local_388 = (void *)0x0;
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar1 != '\0') && ((image->depth | 2U) == 3)) {
    __stream = fopen(name,"wb");
    if (__stream != (FILE *)0x0) {
      local_320[0] = jpeg_std_error(local_d8);
      jpeg_CreateCompress(local_320,0x50,0x248);
      jpeg_stdio_dest(local_320,__stream);
      local_2f0 = CONCAT44((int)image->height,(int)image->width);
      local_2e8 = image->depth;
      local_2e4 = (local_2e8 == 3) + 1;
      jpeg_set_defaults(local_320);
      jpeg_set_quality(local_320,0x5a,1);
      jpeg_start_compress(local_320,1);
      uVar2 = (long)image->depth * image->width;
      uVar9 = 0xffffffffffffffff;
      if (-1 < (long)uVar2) {
        uVar9 = uVar2;
      }
      local_388 = operator_new__(uVar9);
      if (0 < image->height) {
        lVar10 = 0;
        do {
          if (0 < image->width) {
            lVar6 = 0;
            pvVar3 = local_388;
            do {
              if (0 < image->depth) {
                lVar8 = 0;
                do {
                  *(uchar *)((long)pvVar3 + lVar8) = image->img[lVar8][lVar10][lVar6];
                  lVar8 = lVar8 + 1;
                } while (lVar8 < image->depth);
                pvVar3 = (void *)((long)pvVar3 + lVar8);
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < image->width);
          }
          jpeg_write_scanlines(local_320,&local_388,1);
          lVar10 = lVar10 + 1;
        } while (lVar10 < image->height);
      }
      jpeg_finish_compress(local_320);
      if (local_388 != (void *)0x0) {
        operator_delete__(local_388);
      }
      fclose(__stream);
      jpeg_destroy_compress(local_320);
      return;
    }
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_360,name,&local_389);
    std::operator+(&local_340,"Cannot open file for writing (",&local_360);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_340);
    local_380._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_380._M_dataplus._M_p == psVar7) {
      local_380.field_2._M_allocated_capacity = *psVar7;
      local_380.field_2._8_8_ = plVar5[3];
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    }
    else {
      local_380.field_2._M_allocated_capacity = *psVar7;
    }
    local_380._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    gutil::IOException::IOException(pIVar4,&local_380);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_360,name,&local_389);
  std::operator+(&local_340,"Can only save JPG images with depth 1 or 3 (",&local_360);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_340);
  local_380._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_380._M_dataplus._M_p == psVar7) {
    local_380.field_2._M_allocated_capacity = *psVar7;
    local_380.field_2._8_8_ = plVar5[3];
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  }
  else {
    local_380.field_2._M_allocated_capacity = *psVar7;
  }
  local_380._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  gutil::IOException::IOException(pIVar4,&local_380);
  __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void JPEGImageIO::save(const ImageU8 &image, const char *name) const
{
  struct jpeg_compress_struct cinfo;
  struct jpeg_error_mgr jerr;
  JSAMPROW row=0;
  FILE   *out=0;

  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save JPG images with depth 1 or 3 ("+std::string(name)+")");
  }

  // open output file using C methods

  out=fopen(name, "wb");

  if (out == 0)
  {
    throw gutil::IOException("Cannot open file for writing ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_compress(&cinfo);
  jpeg_stdio_dest(&cinfo, out);

  // set image size, color space and quality

  cinfo.image_width=static_cast<JDIMENSION>(image.getWidth());
  cinfo.image_height=static_cast<JDIMENSION>(image.getHeight());
  cinfo.input_components=image.getDepth();

  cinfo.in_color_space=JCS_GRAYSCALE;

  if (image.getDepth() == 3)
  {
    cinfo.in_color_space=JCS_RGB;
  }

  jpeg_set_defaults(&cinfo);
  jpeg_set_quality(&cinfo, 90, TRUE);

  // start compression

  jpeg_start_compress(&cinfo, TRUE);
  row=new JSAMPLE [image.getWidth()*image.getDepth()];

  // write image content line by line

  for (long k=0; k<image.getHeight(); k++)
  {
    JSAMPROW rp=row;

    for (long i=0; i<image.getWidth(); i++)
    {
      for (int j=0; j<image.getDepth(); j++)
      {
        *rp++=static_cast<JSAMPLE>(image.get(i, k, j));
      }
    }

    jpeg_write_scanlines(&cinfo, &row, 1);
  }

  // finish compression and close stream

  jpeg_finish_compress(&cinfo);
  delete [] row;

  fclose(out);

  jpeg_destroy_compress(&cinfo);
}